

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

CPpmd_Void_Ref CutOff(CPpmd8 *p,CTX_PTR ctx,uint order)

{
  uint uVar1;
  Byte *pBVar2;
  uint uVar3;
  CPpmd_Void_Ref CVar4;
  void *pvVar5;
  byte *ptr;
  uint nu;
  CPpmd_State *s2;
  CPpmd_State *s;
  uint local_28;
  uint tmp;
  int i;
  uint order_local;
  CTX_PTR ctx_local;
  CPpmd8 *p_local;
  
  if (ctx->NumStats == '\0') {
    if (p->UnitsStart <= p->Base + ctx->Stats) {
      if (order < p->MaxOrder) {
        CVar4 = CutOff(p,(CTX_PTR)(p->Base + ctx->Stats),order + 1);
        SetSuccessor((CPpmd_State *)&ctx->SummFreq,CVar4);
      }
      else {
        SetSuccessor((CPpmd_State *)&ctx->SummFreq,0);
      }
      if ((ctx->Stats != 0) || (order < 10)) {
        return (int)ctx - (int)p->Base;
      }
    }
    SpecialFreeUnit(p,ctx);
    p_local._4_4_ = 0;
  }
  else {
    nu = ctx->NumStats + 2 >> 1;
    pvVar5 = MoveUnitsUp(p,p->Base + ctx->Stats,nu);
    ctx->Stats = (int)pvVar5 - (int)p->Base;
    local_28 = (uint)ctx->NumStats;
    for (s2 = (CPpmd_State *)(p->Base + (long)(int)local_28 * 6 + (ulong)ctx->Stats);
        (CPpmd_State *)(p->Base + ctx->Stats) <= s2; s2 = s2 + -1) {
      uVar1._0_2_ = s2->SuccessorLow;
      uVar1._2_2_ = s2->SuccessorHigh;
      if (p->Base + uVar1 < p->UnitsStart) {
        pBVar2 = p->Base;
        uVar1 = ctx->Stats;
        SetSuccessor(s2,0);
        SwapStates(s2,(CPpmd_State *)(pBVar2 + (long)(int)local_28 * 6 + (ulong)uVar1));
        local_28 = local_28 - 1;
      }
      else if (order < p->MaxOrder) {
        uVar3._0_2_ = s2->SuccessorLow;
        uVar3._2_2_ = s2->SuccessorHigh;
        CVar4 = CutOff(p,(CTX_PTR)(p->Base + uVar3),order + 1);
        SetSuccessor(s2,CVar4);
      }
      else {
        SetSuccessor(s2,0);
      }
    }
    if ((local_28 != ctx->NumStats) && (order != 0)) {
      ctx->NumStats = (Byte)local_28;
      ptr = p->Base + ctx->Stats;
      if ((int)local_28 < 0) {
        FreeUnits(p,ptr,nu);
        SpecialFreeUnit(p,ctx);
        return 0;
      }
      if (local_28 == 0) {
        ctx->Flags = (ctx->Flags & 0x10) + (0x3f < *ptr) * '\b';
        *(undefined4 *)&ctx->SummFreq = *(undefined4 *)ptr;
        *(undefined2 *)((long)&ctx->Stats + 2) = *(undefined2 *)(ptr + 4);
        FreeUnits(p,ptr,nu);
        *(char *)((long)&ctx->SummFreq + 1) = (char)(*(byte *)((long)&ctx->SummFreq + 1) + 0xb >> 3)
        ;
      }
      else {
        Refresh(p,ctx,nu,(uint)((int)(local_28 * 0x10) < (int)(uint)ctx->SummFreq));
      }
    }
    p_local._4_4_ = (int)ctx - (int)p->Base;
  }
  return p_local._4_4_;
}

Assistant:

static CPpmd_Void_Ref CutOff(CPpmd8 *p, CTX_PTR ctx, unsigned order)
{
  int i;
  unsigned tmp;
  CPpmd_State *s;
  
  if (!ctx->NumStats)
  {
    s = ONE_STATE(ctx);
    if ((Byte *)Ppmd8_GetPtr(p, SUCCESSOR(s)) >= p->UnitsStart)
    {
      if (order < p->MaxOrder)
        SetSuccessor(s, CutOff(p, CTX(SUCCESSOR(s)), order + 1));
      else
        SetSuccessor(s, 0);
      if (SUCCESSOR(s) || order <= 9) /* O_BOUND */
        return REF(ctx);
    }
    SpecialFreeUnit(p, ctx);
    return 0;
  }

  ctx->Stats = STATS_REF(MoveUnitsUp(p, STATS(ctx), tmp = ((unsigned)ctx->NumStats + 2) >> 1));

  for (s = STATS(ctx) + (i = ctx->NumStats); s >= STATS(ctx); s--)
    if ((Byte *)Ppmd8_GetPtr(p, SUCCESSOR(s)) < p->UnitsStart)
    {
      CPpmd_State *s2 = STATS(ctx) + (i--);
      SetSuccessor(s, 0);
      SwapStates(s, s2);
    }
    else if (order < p->MaxOrder)
      SetSuccessor(s, CutOff(p, CTX(SUCCESSOR(s)), order + 1));
    else
      SetSuccessor(s, 0);
    
  if (i != ctx->NumStats && order)
  {
    ctx->NumStats = (Byte)i;
    s = STATS(ctx);
    if (i < 0)
    {
      FreeUnits(p, s, tmp);
      SpecialFreeUnit(p, ctx);
      return 0;
    }
    if (i == 0)
    {
      ctx->Flags = (Byte)((ctx->Flags & 0x10) + 0x08 * (s->Symbol >= 0x40));
      *ONE_STATE(ctx) = *s;
      FreeUnits(p, s, tmp);
      /* 9.31: the code was fixed. It's was not BUG, if Freq <= MAX_FREQ = 124 */
      ONE_STATE(ctx)->Freq = (Byte)(((unsigned)ONE_STATE(ctx)->Freq + 11) >> 3);
    }
    else
      Refresh(p, ctx, tmp, ctx->SummFreq > 16 * i);
  }
  return REF(ctx);
}